

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# znzlib.c
# Opt level: O0

int znzrewind(znzFile stream)

{
  znzFile stream_local;
  
  if (stream == (znzFile)0x0) {
    stream_local._4_4_ = 0;
  }
  else if (stream->zfptr == (gzFile)0x0) {
    rewind((FILE *)stream->nzfptr);
    stream_local._4_4_ = 0;
  }
  else {
    stream_local._4_4_ = gzseek(stream->zfptr,0,0);
  }
  return stream_local._4_4_;
}

Assistant:

int znzrewind(znzFile stream)
{
  if (stream==NULL) { return 0; }
#ifdef HAVE_ZLIB
  /* On some systems, gzrewind() fails for uncompressed files.
     Use gzseek(), instead.               10, May 2005 [rickr]

     if (stream->zfptr!=NULL) return gzrewind(stream->zfptr);
  */

  if (stream->zfptr!=NULL) return (int)gzseek(stream->zfptr, 0L, SEEK_SET);
#endif
  rewind(stream->nzfptr);
  return 0;
}